

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

void __thiscall
Js::PolymorphicInlineCache::CacheProto
          (PolymorphicInlineCache *this,DynamicObject *prototypeObjectWithProperty,
          PropertyId propertyId,PropertyIndex propertyIndex,bool isInlineSlot,bool isMissing,
          Type *type,ScriptContext *requestContext)

{
  bool bVar1;
  Type pIVar2;
  PropertyRecord *pPVar3;
  uint inlineCacheIndex;
  ulong uVar4;
  
  uVar4 = (ulong)this->size + 0xffffffff & (ulong)type >> 6;
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015bbe90,CloneCacheInCollisionPhase);
  inlineCacheIndex = (uint)uVar4;
  if (!bVar1) {
    if (this->inlineCaches[uVar4 & 0xffffffff].u.local.type != (Type *)0x0) {
      pIVar2 = this->inlineCaches + (uVar4 & 0xffffffff);
      if (((((undefined1  [24])((undefined1  [24])pIVar2->u & (undefined1  [24])0x1) ==
             (undefined1  [24])0x0) || ((pIVar2->u).local.typeWithoutProperty == (Type *)0x0)) &&
          ((~*(uint *)((long)&pIVar2->u + 8) & 0xd) != 0)) && (this->size != 1)) {
        if ((undefined1  [24])((undefined1  [24])pIVar2->u & (undefined1  [24])0x1) ==
            (undefined1  [24])0x0) {
          if ((undefined1  [24])((undefined1  [24])pIVar2->u & (undefined1  [24])0x1) ==
              (undefined1  [24])0x0) {
            CloneInlineCacheToEmptySlotInCollision<false,false,true>(this,type,inlineCacheIndex);
          }
          else {
            CloneInlineCacheToEmptySlotInCollision<false,true,false>(this,type,inlineCacheIndex);
          }
        }
        else {
          CloneInlineCacheToEmptySlotInCollision<true,false,false>(this,type,inlineCacheIndex);
        }
      }
    }
  }
  InlineCache::CacheProto
            (this->inlineCaches + (uVar4 & 0xffffffff),prototypeObjectWithProperty,propertyId,
             propertyIndex,isInlineSlot,isMissing,type,requestContext);
  UpdateInlineCachesFillInfo(this,inlineCacheIndex,true);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015cd718,PolymorphicInlineCachePhase);
  if ((bVar1) && (DAT_015d346a == '\x01')) {
    pPVar3 = ScriptContext::GetPropertyName(requestContext,propertyId);
    Output::Print(L"PIC::CacheProto, %s, %d: ",pPVar3 + 1,uVar4 & 0xffffffff);
    InlineCache::Dump(this->inlineCaches + (uVar4 & 0xffffffff));
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void PolymorphicInlineCache::CacheProto(
        DynamicObject *const prototypeObjectWithProperty,
        const PropertyId propertyId,
        const PropertyIndex propertyIndex,
        const bool isInlineSlot,
        const bool isMissing,
        Type *const type,
        ScriptContext *const requestContext)
    {
        uint inlineCacheIndex = GetInlineCacheIndexForType(type);
#if INTRUSIVE_TESTTRACE_PolymorphicInlineCache
        bool collision = !inlineCaches[inlineCacheIndex].IsEmpty();
#endif
        if (!PHASE_OFF1(Js::CloneCacheInCollisionPhase))
        {
            if (!inlineCaches[inlineCacheIndex].IsEmpty() && !inlineCaches[inlineCacheIndex].NeedsToBeRegisteredForStoreFieldInvalidation() && GetSize() != 1)
            {
                if (inlineCaches[inlineCacheIndex].IsLocal())
                {
                    CloneInlineCacheToEmptySlotInCollision<true, false, false>(type, inlineCacheIndex);
                }
                else if (inlineCaches[inlineCacheIndex].IsProto())
                {
                    CloneInlineCacheToEmptySlotInCollision<false, true, false>(type, inlineCacheIndex);
                }
                else
                {
                    CloneInlineCacheToEmptySlotInCollision<false, false, true>(type, inlineCacheIndex);
                }
            }
        }

        inlineCaches[inlineCacheIndex].CacheProto(
            prototypeObjectWithProperty, propertyId, propertyIndex, isInlineSlot, isMissing, type, requestContext);
        UpdateInlineCachesFillInfo(inlineCacheIndex, true /*set*/);

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("PIC::CacheProto, %s, %d: "), requestContext->GetPropertyName(propertyId)->GetBuffer(), inlineCacheIndex);
            inlineCaches[inlineCacheIndex].Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
        PHASE_PRINT_INTRUSIVE_TESTTRACE1(
            Js::PolymorphicInlineCachePhase,
            _u("TestTrace PIC: CacheProto, 0x%x, entryIndex = %d, collision = %s, entries = %d\n"), this, inlineCacheIndex, collision ? _u("true") : _u("false"), GetEntryCount());
    }